

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsParser.cpp
# Opt level: O0

string * GDSkey2ASCII_abi_cxx11_(string *__return_storage_ptr__,uint inHex)

{
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  pointer ppVar4;
  allocator<char> local_c9;
  _Self local_c8;
  uint local_bc;
  _Base_ptr local_b8;
  key_type local_b0 [40];
  string *psStack_10;
  uint inHex_local;
  
  local_b0[0x27] = inHex;
  psStack_10 = __return_storage_ptr__;
  if (GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_);
    if (iVar2 != 0) {
      std::
      map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map(&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_);
      __cxa_atexit(std::
                   map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~map,&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_);
    }
  }
  if (GDSkey2ASCII[abi:cxx11](unsigned_int)::it_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&GDSkey2ASCII[abi:cxx11](unsigned_int)::it_abi_cxx11_);
    if (iVar2 != 0) {
      std::
      _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree_iterator(&GDSkey2ASCII[abi:cxx11](unsigned_int)::it_abi_cxx11_);
      __cxa_guard_release(&GDSkey2ASCII[abi:cxx11](unsigned_int)::it_abi_cxx11_);
    }
  }
  if ((GDSkey2ASCII::readInYet & 1U) == 0) {
    GDSkey2ASCII::readInYet = true;
    local_b0[0x26] = 2;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 0x26
                         );
    std::__cxx11::string::operator=((string *)pmVar3,"HEADER");
    local_b0[0x25] = 0x102;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 0x25
                         );
    std::__cxx11::string::operator=((string *)pmVar3,"BGNLIB");
    local_b0[0x24] = 0x206;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 0x24
                         );
    std::__cxx11::string::operator=((string *)pmVar3,"LIBNAME");
    local_b0[0x23] = 0x305;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 0x23
                         );
    std::__cxx11::string::operator=((string *)pmVar3,"UNITS");
    local_b0[0x22] = 0x400;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 0x22
                         );
    std::__cxx11::string::operator=((string *)pmVar3,"ENDLIB");
    local_b0[0x21] = 0x502;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 0x21
                         );
    std::__cxx11::string::operator=((string *)pmVar3,"BGNSTR");
    local_b0[0x20] = 0x606;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 0x20
                         );
    std::__cxx11::string::operator=((string *)pmVar3,"STRNAME");
    local_b0[0x1f] = 0x700;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 0x1f
                         );
    std::__cxx11::string::operator=((string *)pmVar3,"ENDSTR");
    local_b0[0x1e] = 0x800;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 0x1e
                         );
    std::__cxx11::string::operator=((string *)pmVar3,"BOUNDARY");
    local_b0[0x1d] = 0x900;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 0x1d
                         );
    std::__cxx11::string::operator=((string *)pmVar3,"PATH");
    local_b0[0x1c] = 0xa00;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 0x1c
                         );
    std::__cxx11::string::operator=((string *)pmVar3,"SREF");
    local_b0[0x1b] = 0xb00;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 0x1b
                         );
    std::__cxx11::string::operator=((string *)pmVar3,"AREF");
    local_b0[0x1a] = 0xc00;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 0x1a
                         );
    std::__cxx11::string::operator=((string *)pmVar3,"TEXT");
    local_b0[0x19] = 0xd02;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 0x19
                         );
    std::__cxx11::string::operator=((string *)pmVar3,"LAYER");
    local_b0[0x18] = 0xe02;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 0x18
                         );
    std::__cxx11::string::operator=((string *)pmVar3,"DATATYPE");
    local_b0[0x17] = 0xf03;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 0x17
                         );
    std::__cxx11::string::operator=((string *)pmVar3,"WIDTH");
    local_b0[0x16] = 0x1003;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 0x16
                         );
    std::__cxx11::string::operator=((string *)pmVar3,"XY");
    local_b0[0x15] = 0x1100;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 0x15
                         );
    std::__cxx11::string::operator=((string *)pmVar3,"ENDEL");
    local_b0[0x14] = 0x1206;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 0x14
                         );
    std::__cxx11::string::operator=((string *)pmVar3,"SNAME");
    local_b0[0x13] = 0x1302;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 0x13
                         );
    std::__cxx11::string::operator=((string *)pmVar3,"COLROW");
    local_b0[0x12] = 0x1500;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 0x12
                         );
    std::__cxx11::string::operator=((string *)pmVar3,"NODE");
    local_b0[0x11] = 0x1602;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 0x11
                         );
    std::__cxx11::string::operator=((string *)pmVar3,"TEXTTYPE");
    local_b0[0x10] = 0x1701;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 0x10
                         );
    std::__cxx11::string::operator=((string *)pmVar3,"PRESENTATION");
    local_b0[0xf] = 0x1906;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 0xf)
    ;
    std::__cxx11::string::operator=((string *)pmVar3,"STRING");
    local_b0[0xe] = 0x1a01;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 0xe)
    ;
    std::__cxx11::string::operator=((string *)pmVar3,"STRANS");
    local_b0[0xd] = 0x1b05;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 0xd)
    ;
    std::__cxx11::string::operator=((string *)pmVar3,"MAG");
    local_b0[0xc] = 0x1c05;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 0xc)
    ;
    std::__cxx11::string::operator=((string *)pmVar3,"ANGLE");
    local_b0[0xb] = 0x1f06;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 0xb)
    ;
    std::__cxx11::string::operator=((string *)pmVar3,"REFLIBS");
    local_b0[10] = 0x2006;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 10);
    std::__cxx11::string::operator=((string *)pmVar3,"FONTS");
    local_b0[9] = 0x2102;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 9);
    std::__cxx11::string::operator=((string *)pmVar3,"PATHTYPE");
    local_b0[8] = 0x2202;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 8);
    std::__cxx11::string::operator=((string *)pmVar3,"GENERATIONS");
    local_b0[7] = 0x2306;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 7);
    std::__cxx11::string::operator=((string *)pmVar3,"ATTRTABLE");
    local_b0[6] = 0x2601;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 6);
    std::__cxx11::string::operator=((string *)pmVar3,"EFLAGS");
    local_b0[5] = 0x2a02;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 5);
    std::__cxx11::string::operator=((string *)pmVar3,"NODETYPE");
    local_b0[4] = 0x2b02;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 4);
    std::__cxx11::string::operator=((string *)pmVar3,"PROPATTR");
    local_b0[3] = 0x2c06;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 3);
    std::__cxx11::string::operator=((string *)pmVar3,"PROPVALUE");
    local_b0[2] = 0x2d00;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 2);
    std::__cxx11::string::operator=((string *)pmVar3,"BOX");
    local_b0[1] = 0x2e02;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0 + 1);
    std::__cxx11::string::operator=((string *)pmVar3,"GDS_BOXTYPE");
    local_b0[0] = 0x2f03;
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,local_b0);
    std::__cxx11::string::operator=((string *)pmVar3,"PLEX");
  }
  local_bc = local_b0[0x27];
  GDSkey2ASCII[abi:cxx11](unsigned_int)::it_abi_cxx11_ =
       std::
       map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_,(key_type *)&local_bc);
  local_b8 = GDSkey2ASCII[abi:cxx11](unsigned_int)::it_abi_cxx11_._M_node;
  local_c8._M_node =
       (_Base_ptr)
       std::
       map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&GDSkey2ASCII[abi:cxx11](unsigned_int)::GDSkeys_abi_cxx11_);
  bVar1 = std::operator==(&GDSkey2ASCII[abi:cxx11](unsigned_int)::it_abi_cxx11_,&local_c8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_c9);
    std::allocator<char>::~allocator(&local_c9);
  }
  else {
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&GDSkey2ASCII[abi:cxx11](unsigned_int)::it_abi_cxx11_);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar4->second);
  }
  return __return_storage_ptr__;
}

Assistant:

string GDSkey2ASCII(unsigned int inHex)
{
  static map<int, string> GDSkeys;
  static map<int, string>::iterator it;

  static bool readInYet = false;

  if (!readInYet) {
    readInYet = true;
    GDSkeys[0x0002] = "HEADER";
    GDSkeys[0x0102] = "BGNLIB";
    GDSkeys[0x0206] = "LIBNAME";
    GDSkeys[0x0305] = "UNITS";
    GDSkeys[0x0400] = "ENDLIB";
    GDSkeys[0x0502] = "BGNSTR";
    GDSkeys[0x0606] = "STRNAME";
    GDSkeys[0x0700] = "ENDSTR";
    GDSkeys[0x0800] = "BOUNDARY";
    GDSkeys[0x0900] = "PATH";
    GDSkeys[0x0a00] = "SREF";
    GDSkeys[0x0b00] = "AREF";
    GDSkeys[0x0c00] = "TEXT";
    GDSkeys[0x0d02] = "LAYER";
    GDSkeys[0x0e02] = "DATATYPE";
    GDSkeys[0x0f03] = "WIDTH";
    GDSkeys[0x1003] = "XY";
    GDSkeys[0x1100] = "ENDEL";
    GDSkeys[0x1206] = "SNAME";
    GDSkeys[0x1302] = "COLROW";
    GDSkeys[0x1500] = "NODE";
    GDSkeys[0x1602] = "TEXTTYPE";
    GDSkeys[0x1701] = "PRESENTATION";
    GDSkeys[0x1906] = "STRING";
    GDSkeys[0x1a01] = "STRANS";
    GDSkeys[0x1b05] = "MAG";
    GDSkeys[0x1c05] = "ANGLE";
    GDSkeys[0x1f06] = "REFLIBS";
    GDSkeys[0x2006] = "FONTS";
    GDSkeys[0x2102] = "PATHTYPE";
    GDSkeys[0x2202] = "GENERATIONS";
    GDSkeys[0x2306] = "ATTRTABLE";
    GDSkeys[0x2601] = "EFLAGS";
    GDSkeys[0x2a02] = "NODETYPE";
    GDSkeys[0x2b02] = "PROPATTR";
    GDSkeys[0x2c06] = "PROPVALUE";
    GDSkeys[0x2d00] = "BOX";
    GDSkeys[0x2e02] = "GDS_BOXTYPE";
    GDSkeys[0x2f03] = "PLEX";
  }

  it = GDSkeys.find(inHex);

  if (it == GDSkeys.end())
    return "\0";

  return it->second;
}